

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O0

int CmdCommandDispatch(Abc_Frame_t *pAbc,int *pargc,char ***pargv)

{
  int iVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  double clk;
  char *pcStack_60;
  int fError;
  char *value;
  Abc_Command *pCommand;
  _func_int_Abc_Frame_t_ptr_int_char_ptr_ptr *pFunc;
  Abc_Ntk_t *pNetCopy;
  char **argv2;
  char **argv;
  char ***pppcStack_28;
  int argc;
  char ***pargv_local;
  int *pargc_local;
  Abc_Frame_t *pAbc_local;
  
  argv._4_4_ = *pargc;
  argv2 = *pargv;
  if (argv._4_4_ == 0) {
    pAbc_local._4_4_ = 0;
  }
  else {
    pppcStack_28 = pargv;
    pargv_local = (char ***)pargc;
    pargc_local = (int *)pAbc;
    iVar1 = cmdCheckShellEscape(pAbc,argv._4_4_,argv2);
    if (iVar1 == 1) {
      pAbc_local._4_4_ = 0;
    }
    else {
      iVar1 = st__lookup(*(st__table **)(pargc_local + 4),*argv2,&value);
      if (iVar1 == 0) {
        if ((argv._4_4_ != 1) || (pcVar2 = strstr(*argv2,"."), pcVar2 == (char *)0x0)) {
          fprintf(*(FILE **)(pargc_local + 0x22),"** cmd error: unknown command \'%s\'\n",*argv2);
          fprintf(*(FILE **)(pargc_local + 0x22),
                  "(this is likely caused by using an alias defined in \"abc.rc\"\n");
          fprintf(*(FILE **)(pargc_local + 0x22),
                  "without having this file in the current or parent directory)\n");
          return 1;
        }
        pNetCopy = (Abc_Ntk_t *)CmdAddToArgv(argv._4_4_,argv2);
        CmdFreeArgv(argv._4_4_,argv2);
        argv._4_4_ = argv._4_4_ + 1;
        argv2 = (char **)pNetCopy;
        *(int *)pargv_local = argv._4_4_;
        *pppcStack_28 = (char **)pNetCopy;
        iVar1 = st__lookup(*(st__table **)(pargc_local + 4),*(char **)pNetCopy,&value);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdUtils.c"
                        ,0x7e,"int CmdCommandDispatch(Abc_Frame_t *, int *, char ***)");
        }
      }
      if (((*(int *)(value + 0x18) != 0) && (*(long *)(pargc_local + 0xc) != 0)) &&
         (iVar1 = Abc_FrameIsFlagEnabled("backup"), iVar1 != 0)) {
        pFunc = (_func_int_Abc_Frame_t_ptr_int_char_ptr_ptr *)
                Abc_NtkDup(*(Abc_Ntk_t **)(pargc_local + 0xc));
        Abc_FrameSetCurrentNetwork((Abc_Frame_t *)pargc_local,(Abc_Ntk_t *)pFunc);
        Abc_FrameSwapCurrentAndBackup((Abc_Frame_t *)pargc_local);
      }
      dVar3 = Extra_CpuTimeDouble();
      pCommand = *(Abc_Command **)(value + 0x10);
      clk._4_4_ = (*(code *)pCommand)(pargc_local,argv._4_4_,argv2);
      dVar4 = Extra_CpuTimeDouble();
      *(double *)(pargc_local + 0x26) = (dVar4 - dVar3) + *(double *)(pargc_local + 0x26);
      if (((clk._4_4_ == 0) && (pargc_local[0x16] == 0)) &&
         (iVar1 = st__lookup(*(st__table **)(pargc_local + 8),"autoexec",&stack0xffffffffffffffa0),
         iVar1 != 0)) {
        pargc_local[0x16] = 1;
        clk._4_4_ = Cmd_CommandExecute((Abc_Frame_t *)pargc_local,pcStack_60);
        pargc_local[0x16] = 0;
      }
      pAbc_local._4_4_ = clk._4_4_;
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int CmdCommandDispatch( Abc_Frame_t * pAbc, int * pargc, char *** pargv )
{
    int argc = *pargc;
    char ** argv = *pargv;
    char ** argv2;

    Abc_Ntk_t * pNetCopy;
    int (*pFunc) ( Abc_Frame_t *, int, char ** );
    Abc_Command * pCommand;
    char * value;
    int fError;
    double clk;

    if ( argc == 0 )
        return 0;

    if ( cmdCheckShellEscape( pAbc, argc, argv ) == 1 )
        return 0;

    // get the command
    if ( ! st__lookup( pAbc->tCommands, argv[0], (char **)&pCommand ) )
    {   // the command is not in the table
        // if there is only one word with an extension, assume this is file to be read
        if ( argc == 1 && strstr( argv[0], "." ) )
        {
            // add command 'read' assuming that this is the file name
            argv2 = CmdAddToArgv( argc, argv );
            CmdFreeArgv( argc, argv );
            argc = argc+1;
            argv = argv2;
            *pargc = argc;
            *pargv = argv;
            if ( ! st__lookup( pAbc->tCommands, argv[0], (char **)&pCommand ) )
                assert( 0 );
        }
        else
        {
            fprintf( pAbc->Err, "** cmd error: unknown command '%s'\n", argv[0] );
            fprintf( pAbc->Err, "(this is likely caused by using an alias defined in \"abc.rc\"\n" );
            fprintf( pAbc->Err, "without having this file in the current or parent directory)\n" );
            return 1;
        }
    }

    // get the backup network if the command is going to change the network
    if ( pCommand->fChange ) 
    {
        if ( pAbc->pNtkCur && Abc_FrameIsFlagEnabled( "backup" ) )
        {
            pNetCopy = Abc_NtkDup( pAbc->pNtkCur );
            Abc_FrameSetCurrentNetwork( pAbc, pNetCopy );
            // swap the current network and the backup network 
            // to prevent the effect of resetting the short names
            Abc_FrameSwapCurrentAndBackup( pAbc );
        }
    }

    // execute the command
    clk = Extra_CpuTimeDouble();
    pFunc = (int (*)(Abc_Frame_t *, int, char **))pCommand->pFunc;
    fError = (*pFunc)( pAbc, argc, argv );
    pAbc->TimeCommand += Extra_CpuTimeDouble() - clk;

    // automatic execution of arbitrary command after each command 
    // usually this is a passive command ... 
    if ( fError == 0 && !pAbc->fAutoexac )
    {
        if ( st__lookup( pAbc->tFlags, "autoexec", &value ) )
        {
            pAbc->fAutoexac = 1;
            fError = Cmd_CommandExecute( pAbc, value );
            pAbc->fAutoexac = 0;
        }
    }
    return fError;
}